

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O2

acmod_id_t acmod_set_base_phone(acmod_set_t *acmod_set,acmod_id_t id)

{
  undefined8 in_R9;
  
  if (acmod_set->n_ci <= id) {
    if (id < acmod_set->next_id) {
      return (acmod_id_t)acmod_set->multi[id - acmod_set->n_ci].base;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/acmod_set.c"
            ,0x31c,"acmod_set_base_phone() ID==%u is out-of-range\n",id,in_R9,id);
    id = 0xffffffff;
  }
  return id;
}

Assistant:

acmod_id_t
acmod_set_base_phone(acmod_set_t *acmod_set, acmod_id_t id)
{
    uint32 addr;

    if (id < acmod_set->n_ci)
	return id;
    else if (id < acmod_set->next_id) {
	addr = id - acmod_set->n_ci;

	return acmod_set->multi[addr].base;
    }
    else {
	E_ERROR("acmod_set_base_phone() ID==%u is out-of-range\n", id);
	
	return NO_ACMOD;
    }
}